

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int m_get_rsi_resumable(aec_stream *strm)

{
  uint8_t uVar1;
  internal_state *piVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  
  piVar2 = strm->state;
  do {
    if (strm->avail_in < (ulong)piVar2->bytes_per_sample) {
      if (piVar2->flush != 1) {
        return 0;
      }
      uVar6 = piVar2->i;
      if (uVar6 == 0) {
        piVar2->bits = 0;
        sVar7 = strm->avail_out;
        if (sVar7 == 0) {
          return 0;
        }
        if (piVar2->direct_out == 0) {
          uVar1 = *piVar2->cds;
          puVar4 = strm->next_out;
          strm->next_out = puVar4 + 1;
          *puVar4 = uVar1;
          sVar7 = strm->avail_out;
        }
        strm->avail_out = sVar7 - 1;
        piVar2->flushed = 1;
        return 0;
      }
      piVar2->blocks_avail = uVar6 / strm->block_size - (uint)(uVar6 % strm->block_size == 0);
      puVar3 = piVar2->data_raw;
      do {
        puVar3[uVar6] = puVar3[uVar6 - 1];
        uVar6 = piVar2->i + 1;
        piVar2->i = uVar6;
        uVar8 = strm->block_size * strm->rsi;
      } while (uVar6 < uVar8);
    }
    else {
      uVar5 = (*piVar2->get_sample)(strm);
      piVar2->data_raw[piVar2->i] = uVar5;
      uVar6 = piVar2->i;
      uVar8 = strm->block_size * strm->rsi;
    }
    piVar2->i = uVar6 + 1;
    if (uVar8 <= uVar6 + 1) {
      if ((strm->flags & 8) != 0) {
        (*piVar2->preprocess)(strm);
      }
      m_check_zero_block(strm);
      return 1;
    }
  } while( true );
}

Assistant:

static int m_get_rsi_resumable(struct aec_stream *strm)
{
    /**
       Get RSI while input buffer is short.

       Let user provide more input. Once we got all input pad buffer
       to full RSI.
    */

    struct internal_state *state = strm->state;

    do {
        if (strm->avail_in >= state->bytes_per_sample) {
            state->data_raw[state->i] = state->get_sample(strm);
        } else {
            if (state->flush == AEC_FLUSH) {
                if (state->i > 0) {
                    state->blocks_avail = state->i / strm->block_size - 1;
                    if (state->i % strm->block_size)
                        state->blocks_avail++;
                    do
                        state->data_raw[state->i] =
                            state->data_raw[state->i - 1];
                    while(++state->i < strm->rsi * strm->block_size);
                } else {
                    /* Finish encoding by padding the last byte with
                     * zero bits. */
                    emit(state, 0, state->bits);
                    if (strm->avail_out > 0) {
                        if (!state->direct_out)
                            *strm->next_out++ = *state->cds;
                        strm->avail_out--;
                        state->flushed = 1;
                    }
                    return M_EXIT;
                }
            } else {
                return M_EXIT;
            }
        }
    } while (++state->i < strm->rsi * strm->block_size);

    if (strm->flags & AEC_DATA_PREPROCESS)
        state->preprocess(strm);

    return m_check_zero_block(strm);
}